

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall IR::Instr::HasByteCodeArgOutCapture(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  Instr *pIVar5;
  Instr *this_local;
  
  if ((((this->m_opcode != ArgOut_A_FixupForStackArgs) && (this->m_opcode != ArgOut_A_Inline)) &&
      (this->m_opcode != ArgOut_A)) &&
     ((this->m_opcode != ArgOut_A_InlineBuiltIn && (this->m_opcode != ArgOut_A_FromStackArgs)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xdad,
                       "(this->m_opcode == Js::OpCode::ArgOut_A_FixupForStackArgs || this->m_opcode == Js::OpCode::ArgOut_A_Inline || this->m_opcode == Js::OpCode::ArgOut_A || this->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || this->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)"
                       ,
                       "this->m_opcode == Js::OpCode::ArgOut_A_FixupForStackArgs || this->m_opcode == Js::OpCode::ArgOut_A_Inline || this->m_opcode == Js::OpCode::ArgOut_A || this->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || this->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = Opnd::GetStackSym(this->m_dst);
  if ((*(uint *)&pSVar4->field_0x18 >> 0x19 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    pIVar5 = GetBytecodeArgOutCapture(this);
    if (pIVar5 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xdb0,"(GetBytecodeArgOutCapture() != nullptr)",
                         "GetBytecodeArgOutCapture() != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Instr::HasByteCodeArgOutCapture()
{
    Assert(this->m_opcode == Js::OpCode::ArgOut_A_FixupForStackArgs ||
        this->m_opcode == Js::OpCode::ArgOut_A_Inline ||
        this->m_opcode == Js::OpCode::ArgOut_A ||
        this->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn ||
        this->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs);
    if (this->m_dst->GetStackSym()->m_isArgCaptured)
    {
        Assert(GetBytecodeArgOutCapture() != nullptr);
        return true;
    }
    return false;
}